

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O1

int run_test_socket_buffer_size(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_tcp_t *unaff_RBX;
  uv_udp_t *loop;
  uv_handle_t *handle;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  int iStack_34;
  uv_loop_t *puStack_30;
  void *local_28;
  undefined1 local_20 [24];
  
  puStack_30 = (uv_loop_t *)0x1baa03;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_20 + 8));
  local_20._0_8_ = SEXT48(iVar1);
  local_28 = (void *)0x0;
  if ((void *)local_20._0_8_ == (void *)0x0) {
    puStack_30 = (uv_loop_t *)0x1baa26;
    puVar2 = uv_default_loop();
    puStack_30 = (uv_loop_t *)0x1baa35;
    iVar1 = uv_tcp_init(puVar2,&tcp);
    local_20._0_8_ = SEXT48(iVar1);
    local_28 = (void *)0x0;
    if ((void *)local_20._0_8_ != (void *)0x0) goto LAB_001babd7;
    puStack_30 = (uv_loop_t *)0x1baa66;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)(local_20 + 8),0);
    local_20._0_8_ = SEXT48(iVar1);
    local_28 = (void *)0x0;
    if ((void *)local_20._0_8_ != (void *)0x0) goto LAB_001babe4;
    unaff_RBX = &tcp;
    puStack_30 = (uv_loop_t *)0x1baa93;
    check_buffer_size((uv_handle_t *)&tcp);
    puStack_30 = (uv_loop_t *)0x1baaa2;
    uv_close((uv_handle_t *)&tcp,close_cb);
    puStack_30 = (uv_loop_t *)0x1baaa7;
    puVar2 = uv_default_loop();
    puStack_30 = (uv_loop_t *)0x1baab6;
    iVar1 = uv_udp_init(puVar2,&udp);
    local_20._0_8_ = SEXT48(iVar1);
    local_28 = (void *)0x0;
    if ((void *)local_20._0_8_ != (void *)0x0) goto LAB_001babf1;
    puStack_30 = (uv_loop_t *)0x1baae7;
    iVar1 = uv_udp_bind(&udp,(sockaddr *)(local_20 + 8),0);
    local_20._0_8_ = SEXT48(iVar1);
    local_28 = (void *)0x0;
    loop = (uv_udp_t *)unaff_RBX;
    if ((void *)local_20._0_8_ != (void *)0x0) goto LAB_001babfe;
    loop = &udp;
    puStack_30 = (uv_loop_t *)0x1bab14;
    check_buffer_size((uv_handle_t *)&udp);
    puStack_30 = (uv_loop_t *)0x1bab23;
    uv_close((uv_handle_t *)&udp,close_cb);
    puStack_30 = (uv_loop_t *)0x1bab28;
    puVar2 = uv_default_loop();
    puStack_30 = (uv_loop_t *)0x1bab32;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_20._0_8_ = SEXT48(iVar1);
    local_28 = (void *)0x0;
    if ((void *)local_20._0_8_ != (void *)0x0) goto LAB_001bac0b;
    local_20._0_8_ = (void *)0x2;
    local_28 = (void *)(long)close_cb_called;
    if (local_28 != (void *)0x2) goto LAB_001bac18;
    puStack_30 = (uv_loop_t *)0x1bab78;
    loop = (uv_udp_t *)uv_default_loop();
    puStack_30 = (uv_loop_t *)0x1bab8c;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_30 = (uv_loop_t *)0x1bab96;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    local_20._0_8_ = (void *)0x0;
    puStack_30 = (uv_loop_t *)0x1baba4;
    puVar2 = uv_default_loop();
    puStack_30 = (uv_loop_t *)0x1babac;
    iVar1 = uv_loop_close(puVar2);
    local_28 = (void *)(long)iVar1;
    if ((void *)local_20._0_8_ == local_28) {
      puStack_30 = (uv_loop_t *)0x1babc2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x1babd7;
    run_test_socket_buffer_size_cold_1();
LAB_001babd7:
    puStack_30 = (uv_loop_t *)0x1babe4;
    run_test_socket_buffer_size_cold_2();
LAB_001babe4:
    puStack_30 = (uv_loop_t *)0x1babf1;
    run_test_socket_buffer_size_cold_3();
LAB_001babf1:
    puStack_30 = (uv_loop_t *)0x1babfe;
    run_test_socket_buffer_size_cold_4();
    loop = (uv_udp_t *)unaff_RBX;
LAB_001babfe:
    puStack_30 = (uv_loop_t *)0x1bac0b;
    run_test_socket_buffer_size_cold_5();
LAB_001bac0b:
    puStack_30 = (uv_loop_t *)0x1bac18;
    run_test_socket_buffer_size_cold_6();
LAB_001bac18:
    puStack_30 = (uv_loop_t *)0x1bac25;
    run_test_socket_buffer_size_cold_7();
  }
  handle = (uv_handle_t *)local_20;
  puStack_30 = (uv_loop_t *)check_buffer_size;
  run_test_socket_buffer_size_cold_8();
  iStack_34 = 0;
  puStack_30 = (uv_loop_t *)loop;
  iVar1 = uv_recv_buffer_size(handle,&iStack_34);
  if (iVar1 == 0) {
    if (iStack_34 < 1) goto LAB_001bad12;
    iStack_34 = 10000;
    iVar1 = uv_recv_buffer_size(handle,&iStack_34);
    if (iVar1 != 0) goto LAB_001bad21;
    iStack_34 = 0;
    iVar1 = uv_recv_buffer_size(handle,&iStack_34);
    if (iVar1 == 0) {
      if ((iStack_34 == 10000) || (iStack_34 == 20000)) {
        return iStack_34;
      }
      goto LAB_001bad3f;
    }
  }
  else {
    check_buffer_size_cold_1();
LAB_001bad12:
    check_buffer_size_cold_2();
LAB_001bad21:
    check_buffer_size_cold_3();
  }
  check_buffer_size_cold_4();
LAB_001bad3f:
  check_buffer_size_cold_5();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT_OK(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT_OK(uv_udp_init(uv_default_loop(), &udp));
  ASSERT_OK(uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}